

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void jx9HashmapUnlinkNode(jx9_hashmap_node *pNode)

{
  jx9_hashmap *pjVar1;
  jx9_vm *pVm_00;
  jx9_vm *pVm;
  jx9_hashmap *pMap;
  jx9_hashmap_node *pNode_local;
  
  pjVar1 = pNode->pMap;
  pVm_00 = pjVar1->pVm;
  if (pNode->pPrevCollide == (jx9_hashmap_node *)0x0) {
    pjVar1->apBucket[pNode->nHash & pjVar1->nSize - 1] = pNode->pNextCollide;
  }
  else {
    pNode->pPrevCollide->pNextCollide = pNode->pNextCollide;
  }
  if (pNode->pNextCollide != (jx9_hashmap_node *)0x0) {
    pNode->pNextCollide->pPrevCollide = pNode->pPrevCollide;
  }
  if (pjVar1->pFirst == pNode) {
    pjVar1->pFirst = pNode->pPrev;
  }
  if (pjVar1->pCur == pNode) {
    pjVar1->pCur = pjVar1->pCur->pPrev;
  }
  if (pjVar1->pLast == pNode) {
    pjVar1->pLast = pjVar1->pLast->pNext;
  }
  if (pNode->pPrev != (jx9_hashmap_node *)0x0) {
    pNode->pPrev->pNext = pNode->pNext;
  }
  if (pNode->pNext != (jx9_hashmap_node *)0x0) {
    pNode->pNext->pPrev = pNode->pPrev;
  }
  jx9VmUnsetMemObj(pVm_00,pNode->nValIdx);
  if (pNode->iType == 2) {
    SyBlobRelease(&(pNode->xKey).sKey);
  }
  SyMemBackendPoolFree(&pVm_00->sAllocator,pNode);
  pjVar1->nEntry = pjVar1->nEntry - 1;
  if (pjVar1->nEntry == 0) {
    SyMemBackendFree(&pVm_00->sAllocator,pjVar1->apBucket);
    pjVar1->apBucket = (jx9_hashmap_node **)0x0;
    pjVar1->nSize = 0;
    pjVar1->pCur = (jx9_hashmap_node *)0x0;
    pjVar1->pLast = (jx9_hashmap_node *)0x0;
    pjVar1->pFirst = (jx9_hashmap_node *)0x0;
  }
  return;
}

Assistant:

static void jx9HashmapUnlinkNode(jx9_hashmap_node *pNode)
{
	jx9_hashmap *pMap = pNode->pMap;
	jx9_vm *pVm = pMap->pVm;
	/* Unlink from the corresponding bucket */
	if( pNode->pPrevCollide == 0 ){
		pMap->apBucket[pNode->nHash & (pMap->nSize - 1)] = pNode->pNextCollide;
	}else{
		pNode->pPrevCollide->pNextCollide = pNode->pNextCollide;
	}
	if( pNode->pNextCollide ){
		pNode->pNextCollide->pPrevCollide = pNode->pPrevCollide;
	}
	if( pMap->pFirst == pNode ){
		pMap->pFirst = pNode->pPrev;
	}
	if( pMap->pCur == pNode ){
		/* Advance the node cursor */
		pMap->pCur = pMap->pCur->pPrev; /* Reverse link */
	}
	/* Unlink from the map list */
	MACRO_LD_REMOVE(pMap->pLast, pNode);
	/* Restore to the free list */
	jx9VmUnsetMemObj(pVm, pNode->nValIdx);	
	if( pNode->iType == HASHMAP_BLOB_NODE ){
		SyBlobRelease(&pNode->xKey.sKey);
	}
	SyMemBackendPoolFree(&pVm->sAllocator, pNode);
	pMap->nEntry--;
	if( pMap->nEntry < 1 ){
		/* Free the hash-bucket */
		SyMemBackendFree(&pVm->sAllocator, pMap->apBucket);
		pMap->apBucket = 0;
		pMap->nSize = 0;
		pMap->pFirst = pMap->pLast = pMap->pCur = 0;
	}
}